

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

KeyData * __thiscall
cfd::core::Descriptor::GetKeyData
          (KeyData *__return_storage_ptr__,Descriptor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copy_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_30,array_argument);
  GetKeyDataAll(&local_48,this,&local_30);
  if (local_48.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    KeyData::KeyData(__return_storage_ptr__);
  }
  else {
    KeyData::KeyData(__return_storage_ptr__,
                     local_48.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_48);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

KeyData Descriptor::GetKeyData(
    const std::vector<std::string>& array_argument) const {
  std::vector<std::string> copy_list = array_argument;
  auto key_list = GetKeyDataAll(&copy_list);
  if (key_list.empty()) return KeyData();
  return key_list[0];
}